

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::CompressionParameters> *
kj::_::compareClientAndServerConfigs
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          CompressionParameters *requestConfig,CompressionParameters *manualConfig)

{
  bool bVar1;
  unsigned_long **ppuVar2;
  Fault local_f0;
  unsigned_long *local_e8;
  unsigned_long *_kj_result_3;
  unsigned_long reqBits_1;
  unsigned_long *local_d0;
  Fault local_c8;
  unsigned_long *local_c0;
  unsigned_long *_kj_result_2;
  unsigned_long manualBits_1;
  ulong *local_a8;
  Fault local_a0;
  unsigned_long *local_98;
  unsigned_long *_kj_result_1;
  unsigned_long manualBits;
  Fault local_80;
  unsigned_long *local_78;
  unsigned_long *_kj_result;
  unsigned_long reqBits;
  undefined4 local_60;
  undefined1 local_48 [8];
  CompressionParameters acceptedParameters;
  CompressionParameters *manualConfig_local;
  CompressionParameters *requestConfig_local;
  
  acceptedParameters.inboundMaxWindowBits.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)manualConfig;
  CompressionParameters::CompressionParameters((CompressionParameters *)local_48,manualConfig);
  if ((manualConfig->inboundNoContextTakeover & 1U) == 0) {
    local_48[1] = false;
  }
  if (((manualConfig->outboundNoContextTakeover & 1U) == 0) &&
     (local_48[0] = false, (requestConfig->outboundNoContextTakeover & 1U) == 1)) {
    Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
  }
  else {
    bVar1 = Maybe<unsigned_long>::operator==(&requestConfig->inboundMaxWindowBits);
    if ((((bVar1 ^ 0xffU) & 1) == 0) ||
       (bVar1 = Maybe<unsigned_long>::operator==(&manualConfig->inboundMaxWindowBits),
       ((bVar1 ^ 0xffU) & 1) == 0)) {
      Maybe<unsigned_long>::operator=
                ((Maybe<unsigned_long> *)&acceptedParameters.outboundMaxWindowBits.ptr.field_1);
    }
    else {
      local_78 = readMaybe<unsigned_long>(&requestConfig->inboundMaxWindowBits);
      if (local_78 == (unsigned_long *)0x0) {
        Debug::Fault::Fault(&local_80,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x1454,FAILED,"requestConfig.inboundMaxWindowBits != nullptr","");
        Debug::Fault::fatal(&local_80);
      }
      ppuVar2 = mv<unsigned_long*>(&local_78);
      manualBits = (unsigned_long)*ppuVar2;
      _kj_result = *(unsigned_long **)manualBits;
      local_98 = readMaybe<unsigned_long>(&manualConfig->inboundMaxWindowBits);
      if (local_98 == (unsigned_long *)0x0) {
        Debug::Fault::Fault(&local_a0,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x1455,FAILED,"manualConfig.inboundMaxWindowBits != nullptr","");
        Debug::Fault::fatal(&local_a0);
      }
      ppuVar2 = mv<unsigned_long*>(&local_98);
      local_a8 = *ppuVar2;
      _kj_result_1 = (unsigned_long *)*local_a8;
      if (_kj_result < _kj_result_1) {
        Maybe<unsigned_long>::operator=
                  ((Maybe<unsigned_long> *)&acceptedParameters.outboundMaxWindowBits.ptr.field_1,
                   (unsigned_long *)&_kj_result);
      }
    }
    bVar1 = Maybe<unsigned_long>::operator==(&manualConfig->outboundMaxWindowBits);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Maybe<unsigned_long>::operator=((Maybe<unsigned_long> *)&acceptedParameters);
      bVar1 = Maybe<unsigned_long>::operator==(&requestConfig->outboundMaxWindowBits);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
        goto LAB_00620ce9;
      }
    }
    else {
      local_c0 = readMaybe<unsigned_long>(&manualConfig->outboundMaxWindowBits);
      if (local_c0 == (unsigned_long *)0x0) {
        Debug::Fault::Fault(&local_c8,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x1460,FAILED,"manualConfig.outboundMaxWindowBits != nullptr","");
        Debug::Fault::fatal(&local_c8);
      }
      ppuVar2 = mv<unsigned_long*>(&local_c0);
      local_d0 = *ppuVar2;
      _kj_result_2 = (unsigned_long *)*local_d0;
      bVar1 = Maybe<unsigned_long>::operator==(&requestConfig->outboundMaxWindowBits);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_e8 = readMaybe<unsigned_long>(&requestConfig->outboundMaxWindowBits);
        if (local_e8 == (unsigned_long *)0x0) {
          Debug::Fault::Fault(&local_f0,
                              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                              ,0x1463,FAILED,"requestConfig.outboundMaxWindowBits != nullptr","");
          Debug::Fault::fatal(&local_f0);
        }
        ppuVar2 = mv<unsigned_long*>(&local_e8);
        _kj_result_3 = (unsigned_long *)**ppuVar2;
        if (_kj_result_3 < _kj_result_2) {
          Maybe<unsigned_long>::operator=
                    ((Maybe<unsigned_long> *)&acceptedParameters,(unsigned_long *)&_kj_result_3);
        }
      }
    }
    Maybe<kj::CompressionParameters>::Maybe
              (__return_storage_ptr__,(CompressionParameters *)local_48);
  }
LAB_00620ce9:
  local_60 = 1;
  CompressionParameters::~CompressionParameters((CompressionParameters *)local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> compareClientAndServerConfigs(CompressionParameters requestConfig,
    CompressionParameters manualConfig) {
  // We start from the `manualConfig` and go through a series of filters to get a compression
  // configuration that both the client and the server can agree upon. If no agreement can be made,
  // we return null.

  CompressionParameters acceptedParameters = manualConfig;

  // We only need to modify `client_no_context_takeover` and `server_no_context_takeover` when
  // `manualConfig` doesn't include them.
  if (manualConfig.inboundNoContextTakeover == false) {
    acceptedParameters.inboundNoContextTakeover = false;
  }

  if (manualConfig.outboundNoContextTakeover == false) {
    acceptedParameters.outboundNoContextTakeover = false;
    if (requestConfig.outboundNoContextTakeover == true) {
      // The client has told the server to not use context takeover. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }

  // client_max_window_bits
  if (requestConfig.inboundMaxWindowBits != kj::none &&
      manualConfig.inboundMaxWindowBits != kj::none)  {
    // We want `min(requestConfig, manualConfig)` in this case.
    auto reqBits = KJ_ASSERT_NONNULL(requestConfig.inboundMaxWindowBits);
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.inboundMaxWindowBits);
    if (reqBits < manualBits) {
      acceptedParameters.inboundMaxWindowBits = reqBits;
    }
  } else {
    // We will not reply with `client_max_window_bits`.
    acceptedParameters.inboundMaxWindowBits = kj::none;
  }

  // server_max_window_bits
  if (manualConfig.outboundMaxWindowBits != kj::none) {
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.outboundMaxWindowBits);
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // We want `min(requestConfig, manualConfig)` in this case.
      auto reqBits = KJ_ASSERT_NONNULL(requestConfig.outboundMaxWindowBits);
      if (reqBits < manualBits) {
        acceptedParameters.outboundMaxWindowBits = reqBits;
      }
    }
  } else {
    acceptedParameters.outboundMaxWindowBits = kj::none;
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // The client has told the server to use `server_max_window_bits`. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }
  return acceptedParameters;
}